

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _tree.hpp
# Opt level: O0

void __thiscall
ft::RBTree<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>::
treeTerminate(RBTree<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
              *this)

{
  RBTree<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
  *this_local;
  
  allocator<ft::treeNode<ft::pair<const_int,_int>_>_>::destroy
            ((allocator<ft::treeNode<ft::pair<const_int,_int>_>_> *)&this->field_0x20,this->NIL);
  allocator<ft::treeNode<ft::pair<const_int,_int>_>_>::destroy
            ((allocator<ft::treeNode<ft::pair<const_int,_int>_>_> *)&this->field_0x20,this->m_first)
  ;
  allocator<ft::treeNode<ft::pair<const_int,_int>_>_>::destroy
            ((allocator<ft::treeNode<ft::pair<const_int,_int>_>_> *)&this->field_0x20,this->m_last);
  allocator<ft::treeNode<ft::pair<const_int,_int>_>_>::deallocate
            ((allocator<ft::treeNode<ft::pair<const_int,_int>_>_> *)&this->field_0x20,this->NIL,1);
  allocator<ft::treeNode<ft::pair<const_int,_int>_>_>::deallocate
            ((allocator<ft::treeNode<ft::pair<const_int,_int>_>_> *)&this->field_0x20,this->m_first,
             1);
  allocator<ft::treeNode<ft::pair<const_int,_int>_>_>::deallocate
            ((allocator<ft::treeNode<ft::pair<const_int,_int>_>_> *)&this->field_0x20,this->m_last,1
            );
  return;
}

Assistant:

void treeTerminate() {
		this->m_alloc.destroy(this->NIL);
		this->m_alloc.destroy(this->m_first);
		this->m_alloc.destroy(this->m_last);
		this->m_alloc.deallocate(this->NIL, 1);
		this->m_alloc.deallocate(this->m_first, 1);
		this->m_alloc.deallocate(this->m_last, 1);
	}